

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

NetlistVariableDeclaration * __thiscall
netlist::Netlist::lookupVariable(Netlist *this,string_view hierarchicalPath)

{
  borrowed_iterator_t<netlist::Netlist_&> bVar1;
  NetlistVariableDeclaration *pNVar2;
  anon_class_8_1_9ed3c1cc compareNode;
  size_t local_18;
  char *local_10;
  
  local_10 = hierarchicalPath._M_str;
  local_18 = hierarchicalPath._M_len;
  bVar1 = std::ranges::__find_if_fn::
          operator()<netlist::Netlist_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_netlist_tests____include_Netlist_h:448:28)>
                    ((__find_if_fn *)&std::ranges::find_if,this,&local_18);
  if (bVar1._M_current ==
      (this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes.
      super__Vector_base<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pNVar2 = (NetlistVariableDeclaration *)0x0;
  }
  else {
    pNVar2 = (NetlistVariableDeclaration *)
             ((bVar1._M_current)->_M_t).
             super___uniq_ptr_impl<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>
             .super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl;
  }
  return pNVar2;
}

Assistant:

NetlistVariableDeclaration* lookupVariable(std::string_view hierarchicalPath) {
        auto compareNode = [&hierarchicalPath](const std::unique_ptr<NetlistNode>& node) {
            return node->kind == NodeKind::VariableDeclaration &&
                   node->as<NetlistVariableDeclaration>().hierarchicalPath == hierarchicalPath;
        };
        auto it = std::ranges::find_if(*this, compareNode);
        return it != end() ? &it->get()->as<NetlistVariableDeclaration>() : nullptr;
    }